

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(uchar lhs,SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  char cVar2;
  undefined7 in_register_00000001;
  undefined1 in_SIL;
  uchar ret;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined5 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_00000008;
  uchar in_stack_00000015;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_00000016;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar6;
  undefined4 uVar5;
  long lVar3;
  uint6 uVar4;
  uchar *i;
  
  uVar5 = (undefined4)CONCAT11((char)((uint7)in_register_00000001 >> 0x30),in_SIL);
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffffc);
  lVar3 = (ulong)CONCAT41(uVar5,(char)((uint)uVar5 >> 0x10)) << 0x18;
  bVar1 = DivisionCornerCaseHelper<signed_char,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1(in_stack_00000015,in_stack_00000016,in_stack_00000008);
  if (bVar1) {
    cVar2 = (char)((ulong)lVar3 >> 0x20);
  }
  else {
    SVar6.m_int = (char)((ulong)lVar3 >> 0x30);
    uVar4 = CONCAT51((int5)((ulong)lVar3 >> 0x18),SVar6.m_int);
    bVar1 = DivisionCornerCaseHelper2<signed_char,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::DivisionCornerCase2
                      ((uchar)((ulong)lVar3 >> 0x28),SVar6,
                       (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )&stack0xfffffffffffffffc);
    if (bVar1) {
      cVar2 = (char)(uVar4 >> 0x10);
    }
    else {
      lVar3 = (ulong)uVar4 << 0x10;
      cVar2 = SafeInt::operator_cast_to_signed_char
                        ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)CONCAT17(unaff_retaddr_00,
                                     CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))));
      i = (uchar *)CONCAT71((int7)((ulong)lVar3 >> 8),cVar2);
      DivisionHelper<unsigned_char,_signed_char,_1>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((uchar *)CONCAT17(unaff_retaddr_00,CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr)))
                 ,(char *)i,(uchar *)0x14aae9);
      SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<unsigned_char>
                ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT17(unaff_retaddr_00,CONCAT16(rhs.m_int,CONCAT15(lhs,unaff_retaddr))),i);
      cVar2 = (char)((ulong)i >> 0x38);
    }
  }
  return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)cVar2;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}